

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

LY_ERR lyb_parse_schema_hash
                 (lyd_lyb_ctx *lybctx,lysc_node *sparent,lys_module *mod,lysc_node **snode)

{
  uint8_t *puVar1;
  byte bVar2;
  lylyb_ctx *lybctx_00;
  ly_bool lVar3;
  uint8_t uVar4;
  LY_ERR LVar5;
  lysc_node *last;
  char *format;
  lysc_module *module;
  long lVar6;
  char cVar7;
  uint32_t options;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  bool bVar14;
  uint8_t hash [7];
  
  *snode = (lysc_node *)0x0;
  lybctx_00 = lybctx->lybctx;
  lyb_read(hash,1,lybctx_00);
  if (hash[0] != '\0') {
    for (uVar8 = 0; -1 < (char)(hash[0] << ((byte)uVar8 & 0x1f)); uVar8 = uVar8 + 1) {
      if ((int)uVar8 == 9) {
        ly_log(lybctx_00->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
               ,0x2df);
        return LY_EINT;
      }
    }
    hash[uVar8] = hash[0];
    uVar11 = uVar8 & 0xffffffff;
    uVar9 = uVar8;
    while (cVar7 = (char)uVar11, uVar11 = (ulong)(byte)(cVar7 - 1), cVar7 != '\0') {
      cVar7 = (char)uVar9;
      uVar13 = ((uint)uVar9 & 0xff) - 1;
      lyb_read(hash + uVar13,1,lybctx_00);
      bVar2 = hash[uVar13];
      if (-1 < (char)(bVar2 << ((byte)uVar13 & 0x1f))) {
        __assert_fail("hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1))",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                      ,0x2eb,"LY_ERR lyb_read_hashes(struct lylyb_ctx *, uint8_t *, uint8_t *)");
      }
      uVar9 = uVar11;
      if ((bVar2 >> (9U - cVar7 & 0x1f) & 0x7f) != 0) {
        __assert_fail("!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                      ,0x2ed,"LY_ERR lyb_read_hashes(struct lylyb_ctx *, uint8_t *, uint8_t *)");
      }
    }
    if (hash[0] != '\0') {
      options = (lybctx->int_opts & 4) << 2;
      last = (lysc_node *)0x0;
      while( true ) {
        if ((sparent == (lysc_node *)0x0) && (lybctx->ext != (lysc_ext_instance *)0x0)) {
          last = lys_getnext_ext(last,(lysc_node *)0x0,lybctx->ext,options);
        }
        else {
          if (mod == (lys_module *)0x0) {
            module = (lysc_module *)0x0;
          }
          else {
            module = mod->compiled;
          }
          last = lys_getnext(last,sparent,module,options);
        }
        if (last == (lysc_node *)0x0) break;
        if ((last->module->ctx != lybctx->lybctx->ctx) ||
           (lVar3 = lyb_has_schema_model(last,lybctx->lybctx->models), lVar3 != '\0')) {
          lVar6 = uVar8 + 1;
          lVar12 = 0;
          do {
            bVar14 = lVar6 == 0;
            lVar6 = lVar6 + -1;
            if (bVar14) {
              LVar5 = lyd_parser_check_schema((lyd_ctx *)lybctx,last);
              if (LVar5 != LY_SUCCESS) {
                return LVar5;
              }
              goto LAB_00137e0b;
            }
            uVar4 = lyb_get_hash(last,(uint8_t)lVar12);
            puVar1 = hash + lVar12;
            lVar12 = lVar12 + 1;
          } while (uVar4 == *puVar1);
        }
      }
      if (((ulong)lybctx->field_1 & 0x20000) != 0) {
        if (lybctx->ext == (lysc_ext_instance *)0x0) {
          if (mod == (lys_module *)0x0) {
            pcVar10 = sparent->name;
            format = "Failed to find matching hash for a child node of \"%s\".";
          }
          else {
            pcVar10 = mod->name;
            format = "Failed to find matching hash for a top-level node from \"%s\".";
          }
        }
        else {
          pcVar10 = lybctx->ext->def->name;
          format = "Failed to find matching hash for a node from \"%s\" extension instance node.";
        }
        ly_vlog(lybctx->lybctx->ctx,(char *)0x0,LYVE_REFERENCE,format,pcVar10);
        return LY_EVALID;
      }
LAB_00137e0b:
      *snode = last;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyb_parse_schema_hash(struct lyd_lyb_ctx *lybctx, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_node **snode)
{
    LY_ERR ret;
    const struct lysc_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];
    uint32_t getnext_opts;
    uint8_t hash_count;

    *snode = NULL;

    ret = lyb_read_hashes(lybctx->lybctx, hash, &hash_count);
    LY_CHECK_RET(ret);

    if (!hash[0]) {
        /* opaque node */
        return LY_SUCCESS;
    }

    getnext_opts = lybctx->int_opts & LYD_INTOPT_REPLY ? LYS_GETNEXT_OUTPUT : 0;

    /* find our node with matching hashes */
    sibling = NULL;
    while (1) {
        if (!sparent && lybctx->ext) {
            sibling = lys_getnext_ext(sibling, sparent, lybctx->ext, getnext_opts);
        } else {
            sibling = lys_getnext(sibling, sparent, mod ? mod->compiled : NULL, getnext_opts);
        }
        if (!sibling) {
            break;
        }
        /* skip schema nodes from models not present during printing */
        if (((sibling->module->ctx != lybctx->lybctx->ctx) || lyb_has_schema_model(sibling, lybctx->lybctx->models)) &&
                lyb_is_schema_hash_match((struct lysc_node *)sibling, hash, hash_count)) {
            /* match found */
            break;
        }
    }

    if (!sibling && (lybctx->parse_opts & LYD_PARSE_STRICT)) {
        if (lybctx->ext) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a node from \"%s\" extension instance node.",
                    lybctx->ext->def->name);
        } else if (mod) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a top-level node"
                    " from \"%s\".", mod->name);
        } else {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a child node"
                    " of \"%s\".", sparent->name);
        }
        return LY_EVALID;
    } else if (sibling && (ret = lyd_parser_check_schema((struct lyd_ctx *)lybctx, sibling))) {
        return ret;
    }

    *snode = sibling;
    return LY_SUCCESS;
}